

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsCurveGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,
          Index span)

{
  Index IVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index IVar3;
  reference pvVar4;
  size_type local_48;
  Index i;
  Index first_nonzero_pole_index;
  allocator<long> local_22;
  undefined1 local_21;
  Index local_20;
  Index span_local;
  NurbsCurveGeometry<2L> *this_local;
  vector<long,_std::allocator<long>_> *result;
  
  local_21 = 0;
  local_20 = span;
  span_local = (Index)this;
  this_local = (NurbsCurveGeometry<2L> *)__return_storage_ptr__;
  iVar2 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])();
  std::allocator<long>::allocator(&local_22);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,CONCAT44(extraout_var,iVar2) + 1,&local_22);
  std::allocator<long>::~allocator(&local_22);
  IVar1 = local_20;
  iVar2 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])();
  for (local_48 = 0; IVar3 = length<std::vector<long,std::allocator<long>>>(__return_storage_ptr__),
      (long)local_48 < IVar3; local_48 = local_48 + 1) {
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](__return_storage_ptr__,local_48);
    *pvVar4 = (IVar1 - CONCAT44(extraout_var_00,iVar2)) + 1 + local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span) const
    {
        std::vector<Index> result(degree() + 1);

        const Index first_nonzero_pole_index = span - degree() + 1;

        for (Index i = 0; i < length(result); i++) {
            result[i] = first_nonzero_pole_index + i;
        }

        return result;
    }